

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  undefined6 in_register_0000003a;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0x164) {
    this = ParseableFunctionInfo::GetNestedFunctionProxy
                     (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
    uVar1 = data->R0;
    uVar2 = data->R1;
    uVar3 = data->R2;
    uVar4 = data->R3;
    pPVar8 = FunctionProxy::EnsureDeserialized(this);
    iVar7 = (*(pPVar8->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pPVar8);
    Output::Print(L" R%d, R%d = R%d, R%d, %s()",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                  CONCAT44(extraout_var,iVar7));
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar9 = 1;
  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                              ,0x54d,"(false)","Unknown Reg4U opcode");
  if (bVar6) {
    *puVar9 = 0;
    return;
  }
  pcVar5 = (code *)invalidInstructionException();
  (*pcVar5)();
}

Assistant:

void
    ByteCodeDumper::DumpReg4U(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitClass:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d, R%d = R%d, R%d, %s()"), data->R0, data->R1, data->R2, data->R3,
                    pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }

            default:
                AssertMsg(false, "Unknown Reg4U opcode");
                break;
        }
    }